

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O2

void __thiscall Object_GetNotFound_Test::TestBody(Object_GetNotFound_Test *this)

{
  char *message;
  initializer_list<pstore::dump::object::member> __l;
  char *in_stack_ffffffffffffff40;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_b8;
  undefined1 local_a0 [16];
  AssertionResult gtest_ar;
  member local_70;
  value_ptr v;
  undefined1 local_30 [32];
  bool local_10;
  
  pstore::dump::make_value(in_stack_ffffffffffffff40);
  std::__cxx11::string::string((string *)&gtest_ar,"key",(allocator *)local_a0);
  pstore::dump::object::member::member(&local_70,(string *)&gtest_ar,&v);
  __l._M_len = 1;
  __l._M_array = &local_70;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_b8,__l,(allocator_type *)&stack0xffffffffffffff47);
  local_30._0_8_ = &PTR__object_001dab90;
  local_30._8_8_ =
       local_b8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_30._16_8_ =
       local_b8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30._24_8_ =
       local_b8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10 = false;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_b8);
  pstore::dump::object::member::~member(&local_70);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_b8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_70,"missing",(allocator *)&stack0xffffffffffffff47);
  pstore::dump::object::get((object *)local_a0,(string *)local_30);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>>
            ((internal *)&gtest_ar,"std::shared_ptr<value> (nullptr)","object.get (\"missing\")",
             (shared_ptr<pstore::dump::value> *)&local_b8,
             (shared_ptr<pstore::dump::value> *)local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_b8.
              super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0xa3,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_70.property._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_70.property._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::dump::object::~object((object *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST (Object, GetNotFound) {
    using namespace ::pstore::dump;
    auto v = make_value ("Hello World");
    object object{{{"key", v}}};
    EXPECT_EQ (std::shared_ptr<value> (nullptr), object.get ("missing"));
}